

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O0

ConsCell * find_close_prior_cell(conspage *page,LispPTR oldcell)

{
  uint uVar1;
  uint uVar2;
  ConsCell *pCVar3;
  ConsCell *cell;
  uint local_28;
  uint noffset;
  uint prior;
  uint offset;
  uint oldoffset;
  LispPTR oldcell_local;
  conspage *page_local;
  
  uVar2 = oldcell & 0xff;
  noffset = *(uint *)&page->field_0x8 >> 0x10 & 0xff;
  local_28 = 0;
  while( true ) {
    if (noffset == 0) {
      return (ConsCell *)0x0;
    }
    if ((noffset < uVar2) && (uVar2 - 0xe <= noffset)) break;
    local_28 = noffset;
    noffset = *(uint *)((long)&page->cell6 + (ulong)noffset * 2) >> 0x18;
  }
  uVar1 = *(uint *)((long)&page->cell6 + (ulong)noffset * 2);
  while (cell._4_4_ = uVar1 >> 0x18, noffset < cell._4_4_ && cell._4_4_ < uVar2) {
    local_28 = noffset;
    uVar1 = *(uint *)((long)&page->cell6 + (ulong)cell._4_4_ * 2);
    noffset = cell._4_4_;
  }
  pCVar3 = (ConsCell *)((long)&page->cell6 + (ulong)noffset * 2);
  if (local_28 == 0) {
    *(uint *)&page->field_0x8 =
         *(uint *)&page->field_0x8 & 0xff00ffff |
         (*(uint *)((long)&page->cell6 + (ulong)noffset * 2) >> 0x18) << 0x10;
  }
  else {
    *(uint *)((long)&page->cell6 + (ulong)local_28 * 2) =
         *(uint *)((long)&page->cell6 + (ulong)local_28 * 2) & 0xffffff |
         *(uint *)((long)&page->cell6 + (ulong)noffset * 2) & 0xff000000;
  }
  *(uint *)&page->field_0x8 =
       *(uint *)&page->field_0x8 & 0xffffff | ((*(uint *)&page->field_0x8 >> 0x18) - 1) * 0x1000000;
  *(uint *)&pCVar3->field_0x0 =
       *(uint *)&pCVar3->field_0x0 & 0xfffffff | (uVar2 - noffset >> 1 & 0xf | 8) << 0x1c;
  if (noffset + (*(uint *)&pCVar3->field_0x0 >> 0x1c & 7) * 2 < 0xff) {
    return pCVar3;
  }
  error("in fcpc, page overflow.");
  return pCVar3;
}

Assistant:

ConsCell *find_close_prior_cell(struct conspage *page, LispPTR oldcell) {
  unsigned oldoffset = oldcell & 0xFF;
  unsigned offset = page->next_cell;
  unsigned prior = 0;
  unsigned noffset;
  ConsCell *cell;

  while (offset) {
    if ((offset < oldoffset) && (offset >= (oldoffset - 14))) {
      noffset = FREECONS(page, offset)->next_free;
      while ((noffset > offset) && (noffset < oldoffset)) {
        prior = offset;
        offset = noffset;
        noffset = FREECONS(page, offset)->next_free;
      }
      cell = (ConsCell *)((DLword *)page + offset);
      if (prior)
        FREECONS(page, prior)->next_free = FREECONS(page, offset)->next_free;
      else
        page->next_cell = FREECONS(page, offset)->next_free;
      page->count -= 1;
      cell->cdr_code = CDR_ONPAGE | ((oldoffset - offset) >> 1);
      if (254 < (offset + ((cell->cdr_code & 7) << 1))) error("in fcpc, page overflow.");
      return (cell);
    }

    prior = offset;
    offset = ((freecons *)((DLword *)page + offset))->next_free;
  }
  return ((ConsCell *)0); /* No cell close enough */
}